

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator<<(QDBusArgument *arg,QVariantMap *map)

{
  bool bVar1;
  QMetaType QVar2;
  _Base_ptr in_RDI;
  long in_FS_OFFSET;
  QVariant *value;
  QString *key;
  QKeyValueRange<const_QMap<QString,_QVariant>_&> *__range1;
  const_key_value_iterator __end1;
  const_key_value_iterator __begin1;
  QVariant *in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  const_iterator lhs;
  QString *in_stack_ffffffffffffff68;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs._M_node = in_RDI;
  QVar2 = QMetaType::fromType<QString>();
  QMetaType::fromType<QDBusVariant>();
  QDBusArgument::beginMap((QMetaType *)lhs._M_node,(QMetaType *)QVar2.d_ptr);
  QMap<QString,_QVariant>::asKeyValueRange
            ((QMap<QString,_QVariant> *)in_stack_ffffffffffffff50._M_node);
  QtPrivate::QKeyValueRange<const_QMap<QString,_QVariant>_&>::begin
            ((QKeyValueRange<const_QMap<QString,_QVariant>_&> *)in_stack_ffffffffffffff48);
  QtPrivate::QKeyValueRange<const_QMap<QString,_QVariant>_&>::end
            ((QKeyValueRange<const_QMap<QString,_QVariant>_&> *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = operator!=((QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
                        )lhs._M_node,
                       (QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
                        )in_stack_ffffffffffffff50._M_node);
    if (!bVar1) break;
    QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>::
    operator*((QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
               *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff68 =
         std::get<0ul,QString_const&,QVariant_const&>
                   ((pair<const_QString_&,_const_QVariant_&> *)0xaf8d3a);
    std::get<1ul,QString_const&,QVariant_const&>
              ((pair<const_QString_&,_const_QVariant_&> *)0xaf8d58);
    QDBusArgument::beginMapEntry();
    in_stack_ffffffffffffff50._M_node =
         (_Base_ptr)QDBusArgument::operator<<(in_RDI,(QString *)in_stack_ffffffffffffff68);
    QDBusVariant::QDBusVariant
              ((QDBusVariant *)in_stack_ffffffffffffff50._M_node,in_stack_ffffffffffffff48);
    QDBusArgument::operator<<
              ((QDBusArgument *)in_stack_ffffffffffffff50._M_node,(QDBusVariant *)local_28);
    QDBusVariant::~QDBusVariant((QDBusVariant *)0xaf8dac);
    QDBusArgument::endMapEntry();
    QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>::
    operator++((QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
                *)in_stack_ffffffffffffff50._M_node);
  }
  QDBusArgument::endMap();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDBusArgument *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusArgument &operator<<(QDBusArgument &arg, const QVariantMap &map)
{
    arg.beginMap(QMetaType::fromType<QString>(), QMetaType::fromType<QDBusVariant>());
    for (const auto &[key, value] : map.asKeyValueRange()) {
        arg.beginMapEntry();
        arg << key << QDBusVariant(value);
        arg.endMapEntry();
    }
    arg.endMap();
    return arg;
}